

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_node<std::istream,long,unsigned_long>
               (SingleTreeIndex *node,basic_istream<char,_std::char_traits<char>_> *in,
               vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  byte bVar1;
  byte in_CL;
  size_t in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  size_t vec_size;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  
  bVar1 = in_CL & 1;
  if (!interrupt_switch) {
    read_bytes<unsigned_long,unsigned_long>
              (in_RSI,in_RDX,
               (istream *)(CONCAT17(in_CL,in_stack_ffffffffffffffe0) & 0x1ffffffffffffff),
               in_stack_ffffffffffffffd8,false);
    read_bytes<unsigned_long,unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,in_RDX,
               (istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,false)
    ;
    read_bytes<unsigned_long,unsigned_long>
              (in_RSI,in_RDX,(istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<double,double>
              (in_RSI,in_RDX,(istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<unsigned_long,unsigned_long>
              (in_RSI,in_RDX,(istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<double,double>
              (in_RSI,in_RDX,(istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<unsigned_long,unsigned_long>
              (in_RSI,in_RDX,(istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<unsigned_long,unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,in_RDX,
               (istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,false)
    ;
    read_bytes<unsigned_long,unsigned_long>
              (in_RSI,in_RDX,(istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<unsigned_long,unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,in_RDX,
               (istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,false)
    ;
    read_bytes<unsigned_long,unsigned_long>
              (in_RSI,in_RDX,(istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
    read_bytes<unsigned_long,unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RSI,in_RDX,
               (istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8,false)
    ;
    read_bytes<unsigned_long,unsigned_long>
              (in_RSI,in_RDX,(istream *)CONCAT17(bVar1,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8,false);
  }
  return;
}

Assistant:

void deserialize_node(SingleTreeIndex &node, itype &in, std::vector<char> &buffer, const bool diff_endian)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.terminal_node_mappings, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_distances, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<double, double>(node.node_depths, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_points, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_indptr, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&vec_size, (size_t)1, in, buffer, diff_endian);
    read_bytes<size_t, saved_size_t>(node.reference_mapping, vec_size, in, buffer, diff_endian);

    read_bytes<size_t, saved_size_t>((void*)&node.n_terminal, (size_t)1, in, buffer, diff_endian);
}